

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<CURLcode_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<CURLcode_const&> *this,CURLcode *rhs)

{
  CURLcode *lhs;
  allocator local_69;
  string local_68 [32];
  lest local_48 [39];
  bool local_21;
  CURLcode *local_20;
  CURLcode *rhs_local;
  expression_lhs<const_CURLcode_&> *this_local;
  
  local_21 = **(CURLcode **)this != *rhs;
  lhs = *(CURLcode **)this;
  local_20 = rhs;
  rhs_local = (CURLcode *)this;
  this_local = (expression_lhs<const_CURLcode_&> *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"!=",&local_69);
  to_string<CURLcode,CURLcode>(local_48,lhs,(string *)local_68,local_20);
  lest::result::result<bool>(__return_storage_ptr__,&local_21,(text *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result{ lhs == rhs, to_string( lhs, "==", rhs ) }; }